

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

size_t __thiscall
ddd::DaTrie<false,_false,_false>::edge_size_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,size_t upper)

{
  ulong uVar1;
  pointer pBVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = SUB84(pBVar2[node_pos],0);
  if (((int)uVar4 < 0) || (uVar4 == 0x7fffffff)) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    do {
      uVar1 = uVar3 + 1;
      bVar6 = (*(uint *)&pBVar2[uVar5 ^ uVar4].field_0x4 & 0x7fffffff) == node_pos;
      if (bVar6) {
        uVar3 = uVar1;
      }
    } while ((!bVar6 || uVar1 < upper) && (bVar6 = uVar5 != 0xff, uVar5 = uVar5 + 1, bVar6));
  }
  return uVar3;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }